

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerMSL::to_function_name_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,TextureFunctionNameArguments *args)

{
  uint uVar1;
  MSLFormatResolution MVar2;
  bool bVar3;
  SPIRVariable *pSVar4;
  MSLConstexprSampler *pMVar5;
  SPIRCombinedImageSampler *pSVar6;
  size_type sVar7;
  CompilerError *pCVar8;
  uint32_t chain;
  uint32_t id;
  char *pcVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  chain = (args->base).img.id;
  pSVar4 = Compiler::maybe_get_backing_variable((Compiler *)this,chain);
  if (pSVar4 == (SPIRVariable *)0x0) {
    bVar3 = false;
    pMVar5 = (MSLConstexprSampler *)0x0;
  }
  else {
    id = (pSVar4->basevariable).id;
    if (id == 0) {
      id = (pSVar4->super_IVariant).self.id;
    }
    pMVar5 = find_constexpr_sampler(this,id);
    bVar3 = Compiler::has_extended_decoration
                      ((Compiler *)this,(pSVar4->super_IVariant).self.id,
                       SPIRVCrossDecorationDynamicImageSampler);
  }
  if ((((this->msl_options).swizzle_texture_samples == true) &&
      ((args->base).is_gather == true && bVar3 == false)) &&
     ((pMVar5 == (MSLConstexprSampler *)0x0 || (pMVar5->ycbcr_conversion_enable == false)))) {
    local_70._M_dataplus._M_p._0_4_ = chain;
    sVar7 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(this->super_CompilerGLSL).super_Compiler.comparison_ids._M_h,
                    (key_type *)&local_70);
    pcVar9 = "spvGatherCompareSwizzle";
    if (sVar7 == 0) {
      pcVar9 = "spvGatherSwizzle";
    }
    add_spv_func_and_recompile(this,sVar7 == 0 ^ SPVFuncImplGatherCompareSwizzle);
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar9,(allocator *)&local_70);
  }
  else {
    pSVar6 = Compiler::maybe_get<spirv_cross::SPIRCombinedImageSampler>((Compiler *)this,chain);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (((pMVar5 == (MSLConstexprSampler *)0x0) || (pMVar5->ycbcr_conversion_enable != true)) ||
       (uVar1 = pMVar5->planes, bVar3 != false || uVar1 < 2)) {
      if (pSVar6 != (SPIRCombinedImageSampler *)0x0) {
        chain = (pSVar6->image).id;
      }
      CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,chain,true);
      ::std::operator+(&local_70,&local_50,".");
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
      ::std::__cxx11::string::~string((string *)&local_70);
      ::std::__cxx11::string::~string((string *)&local_50);
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      if (args->has_dref != true) {
        return __return_storage_ptr__;
      }
    }
    else {
      if ((uVar1 & 0xfffffffe) != 2) {
        pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_70,"Unhandled number of color image planes!",
                   (allocator *)&local_50);
        CompilerError::CompilerError(pCVar8,&local_70);
        __cxa_throw(pCVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((pMVar5->resolution == MSL_FORMAT_RESOLUTION_444) ||
         (pMVar5->chroma_filter == MSL_SAMPLER_FILTER_NEAREST)) {
        add_spv_func_and_recompile(this,(uVar1 != 2) + SPVFuncImplChromaReconstructNearest2Plane);
        ::std::__cxx11::string::assign((char *)__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      ::std::__cxx11::string::assign((char *)__return_storage_ptr__);
      MVar2 = pMVar5->resolution;
      if (MVar2 == MSL_FORMAT_RESOLUTION_422) {
        if (pMVar5->x_chroma_offset == MSL_CHROMA_LOCATION_MIDPOINT) {
          add_spv_func_and_recompile
                    (this,(pMVar5->planes != 2) +
                          SPVFuncImplChromaReconstructLinear422Midpoint2Plane);
        }
        else {
          if (pMVar5->x_chroma_offset != MSL_CHROMA_LOCATION_COSITED_EVEN) {
            pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&local_70,"Invalid chroma location.",(allocator *)&local_50);
            CompilerError::CompilerError(pCVar8,&local_70);
            __cxa_throw(pCVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          add_spv_func_and_recompile
                    (this,(pMVar5->planes != 2) +
                          SPVFuncImplChromaReconstructLinear422CositedEven2Plane);
        }
      }
      else {
        if (MVar2 != MSL_FORMAT_RESOLUTION_420) {
          if (MVar2 != MSL_FORMAT_RESOLUTION_444) {
            pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&local_70,"Invalid format resolution.",(allocator *)&local_50);
            CompilerError::CompilerError(pCVar8,&local_70);
            __cxa_throw(pCVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                        ,0x28ea,
                        "virtual string spirv_cross::CompilerMSL::to_function_name(const TextureFunctionNameArguments &)"
                       );
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        if (pMVar5->x_chroma_offset == MSL_CHROMA_LOCATION_MIDPOINT) {
          if (pMVar5->y_chroma_offset == MSL_CHROMA_LOCATION_MIDPOINT) {
            add_spv_func_and_recompile
                      (this,(pMVar5->planes != 2) +
                            SPVFuncImplChromaReconstructLinear420XMidpointYMidpoint2Plane);
          }
          else {
            if (pMVar5->y_chroma_offset != MSL_CHROMA_LOCATION_COSITED_EVEN) {
              pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&local_70,"Invalid Y chroma location.",(allocator *)&local_50);
              CompilerError::CompilerError(pCVar8,&local_70);
              __cxa_throw(pCVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            add_spv_func_and_recompile
                      (this,(pMVar5->planes != 2) +
                            SPVFuncImplChromaReconstructLinear420XMidpointYCositedEven2Plane);
          }
        }
        else {
          if (pMVar5->x_chroma_offset != MSL_CHROMA_LOCATION_COSITED_EVEN) {
            pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&local_70,"Invalid X chroma location.",(allocator *)&local_50);
            CompilerError::CompilerError(pCVar8,&local_70);
            __cxa_throw(pCVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          if (pMVar5->y_chroma_offset == MSL_CHROMA_LOCATION_MIDPOINT) {
            add_spv_func_and_recompile
                      (this,(pMVar5->planes != 2) +
                            SPVFuncImplChromaReconstructLinear420XCositedEvenYMidpoint2Plane);
          }
          else {
            if (pMVar5->y_chroma_offset != MSL_CHROMA_LOCATION_COSITED_EVEN) {
              pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&local_70,"Invalid Y chroma location.",(allocator *)&local_50);
              CompilerError::CompilerError(pCVar8,&local_70);
              __cxa_throw(pCVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            add_spv_func_and_recompile
                      (this,(pMVar5->planes != 2) +
                            SPVFuncImplChromaReconstructLinear420XCositedEvenYCositedEven2Plane);
          }
        }
      }
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_function_name(const TextureFunctionNameArguments &args)
{
	VariableID img = args.base.img;
	const MSLConstexprSampler *constexpr_sampler = nullptr;
	bool is_dynamic_img_sampler = false;
	if (auto *var = maybe_get_backing_variable(img))
	{
		constexpr_sampler = find_constexpr_sampler(var->basevariable ? var->basevariable : VariableID(var->self));
		is_dynamic_img_sampler = has_extended_decoration(var->self, SPIRVCrossDecorationDynamicImageSampler);
	}

	// Special-case gather. We have to alter the component being looked up
	// in the swizzle case.
	if (msl_options.swizzle_texture_samples && args.base.is_gather && !is_dynamic_img_sampler &&
	    (!constexpr_sampler || !constexpr_sampler->ycbcr_conversion_enable))
	{
		bool is_compare = comparison_ids.count(img);
		add_spv_func_and_recompile(is_compare ? SPVFuncImplGatherCompareSwizzle : SPVFuncImplGatherSwizzle);
		return is_compare ? "spvGatherCompareSwizzle" : "spvGatherSwizzle";
	}

	auto *combined = maybe_get<SPIRCombinedImageSampler>(img);

	// Texture reference
	string fname;
	if (needs_chroma_reconstruction(constexpr_sampler) && !is_dynamic_img_sampler)
	{
		if (constexpr_sampler->planes != 2 && constexpr_sampler->planes != 3)
			SPIRV_CROSS_THROW("Unhandled number of color image planes!");
		// 444 images aren't downsampled, so we don't need to do linear filtering.
		if (constexpr_sampler->resolution == MSL_FORMAT_RESOLUTION_444 ||
		    constexpr_sampler->chroma_filter == MSL_SAMPLER_FILTER_NEAREST)
		{
			if (constexpr_sampler->planes == 2)
				add_spv_func_and_recompile(SPVFuncImplChromaReconstructNearest2Plane);
			else
				add_spv_func_and_recompile(SPVFuncImplChromaReconstructNearest3Plane);
			fname = "spvChromaReconstructNearest";
		}
		else // Linear with a downsampled format
		{
			fname = "spvChromaReconstructLinear";
			switch (constexpr_sampler->resolution)
			{
			case MSL_FORMAT_RESOLUTION_444:
				assert(false);
				break; // not reached
			case MSL_FORMAT_RESOLUTION_422:
				switch (constexpr_sampler->x_chroma_offset)
				{
				case MSL_CHROMA_LOCATION_COSITED_EVEN:
					if (constexpr_sampler->planes == 2)
						add_spv_func_and_recompile(SPVFuncImplChromaReconstructLinear422CositedEven2Plane);
					else
						add_spv_func_and_recompile(SPVFuncImplChromaReconstructLinear422CositedEven3Plane);
					fname += "422CositedEven";
					break;
				case MSL_CHROMA_LOCATION_MIDPOINT:
					if (constexpr_sampler->planes == 2)
						add_spv_func_and_recompile(SPVFuncImplChromaReconstructLinear422Midpoint2Plane);
					else
						add_spv_func_and_recompile(SPVFuncImplChromaReconstructLinear422Midpoint3Plane);
					fname += "422Midpoint";
					break;
				default:
					SPIRV_CROSS_THROW("Invalid chroma location.");
				}
				break;
			case MSL_FORMAT_RESOLUTION_420:
				fname += "420";
				switch (constexpr_sampler->x_chroma_offset)
				{
				case MSL_CHROMA_LOCATION_COSITED_EVEN:
					switch (constexpr_sampler->y_chroma_offset)
					{
					case MSL_CHROMA_LOCATION_COSITED_EVEN:
						if (constexpr_sampler->planes == 2)
							add_spv_func_and_recompile(
							    SPVFuncImplChromaReconstructLinear420XCositedEvenYCositedEven2Plane);
						else
							add_spv_func_and_recompile(
							    SPVFuncImplChromaReconstructLinear420XCositedEvenYCositedEven3Plane);
						fname += "XCositedEvenYCositedEven";
						break;
					case MSL_CHROMA_LOCATION_MIDPOINT:
						if (constexpr_sampler->planes == 2)
							add_spv_func_and_recompile(
							    SPVFuncImplChromaReconstructLinear420XCositedEvenYMidpoint2Plane);
						else
							add_spv_func_and_recompile(
							    SPVFuncImplChromaReconstructLinear420XCositedEvenYMidpoint3Plane);
						fname += "XCositedEvenYMidpoint";
						break;
					default:
						SPIRV_CROSS_THROW("Invalid Y chroma location.");
					}
					break;
				case MSL_CHROMA_LOCATION_MIDPOINT:
					switch (constexpr_sampler->y_chroma_offset)
					{
					case MSL_CHROMA_LOCATION_COSITED_EVEN:
						if (constexpr_sampler->planes == 2)
							add_spv_func_and_recompile(
							    SPVFuncImplChromaReconstructLinear420XMidpointYCositedEven2Plane);
						else
							add_spv_func_and_recompile(
							    SPVFuncImplChromaReconstructLinear420XMidpointYCositedEven3Plane);
						fname += "XMidpointYCositedEven";
						break;
					case MSL_CHROMA_LOCATION_MIDPOINT:
						if (constexpr_sampler->planes == 2)
							add_spv_func_and_recompile(SPVFuncImplChromaReconstructLinear420XMidpointYMidpoint2Plane);
						else
							add_spv_func_and_recompile(SPVFuncImplChromaReconstructLinear420XMidpointYMidpoint3Plane);
						fname += "XMidpointYMidpoint";
						break;
					default:
						SPIRV_CROSS_THROW("Invalid Y chroma location.");
					}
					break;
				default:
					SPIRV_CROSS_THROW("Invalid X chroma location.");
				}
				break;
			default:
				SPIRV_CROSS_THROW("Invalid format resolution.");
			}
		}
	}
	else
	{
		fname = to_expression(combined ? combined->image : img) + ".";

		// Texture function and sampler
		if (args.base.is_fetch)
			fname += "read";
		else if (args.base.is_gather)
			fname += "gather";
		else
			fname += "sample";

		if (args.has_dref)
			fname += "_compare";
	}

	return fname;
}